

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locator.cpp
# Opt level: O0

void __thiscall DSDcc::Locator::Locator(Locator *this,string *loc_string)

{
  long lVar1;
  undefined8 uVar2;
  char *pcVar3;
  LocatorInvalidException *this_00;
  string *locator_str;
  string *in_RSI;
  int *in_RDI;
  size_type sz;
  string *in_stack_fffffffffffffe58;
  LocatorInvalidException *in_stack_fffffffffffffe60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe78;
  string local_150 [39];
  undefined1 local_129;
  string local_128 [39];
  undefined1 local_101;
  string local_100 [39];
  undefined1 local_d9;
  string local_d8 [39];
  undefined1 local_b1;
  string local_b0 [39];
  undefined1 local_89;
  string local_88 [32];
  long local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_3d;
  string local_30 [48];
  
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 6) {
    local_3d = 1;
    uVar2 = __cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_30,in_RSI);
    LocatorInvalidException::LocatorInvalidException
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_3d = 0;
    __cxa_throw(uVar2,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  local_48 = std::__cxx11::string::begin();
  local_50 = std::__cxx11::string::end();
  local_58 = std::__cxx11::string::begin();
  local_60 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                in_stack_fffffffffffffe68,(_func_int_int *)in_stack_fffffffffffffe60
                               );
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_68 = std::__cxx11::string::find('p',(ulong)(uint)(int)*pcVar3);
  if (local_68 == -1) {
    local_89 = 1;
    uVar2 = __cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_88,in_RSI);
    LocatorInvalidException::LocatorInvalidException
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_89 = 0;
    __cxa_throw(uVar2,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  in_RDI[3] = (int)local_68;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_68 = std::__cxx11::string::find(-0x70,(ulong)(uint)(int)*pcVar3);
  if (local_68 == -1) {
    local_b1 = 1;
    uVar2 = __cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_b0,in_RSI);
    LocatorInvalidException::LocatorInvalidException
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_b1 = 0;
    __cxa_throw(uVar2,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  *in_RDI = (int)local_68;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_68 = std::__cxx11::string::find(-0x50,(ulong)(uint)(int)*pcVar3);
  if (local_68 == -1) {
    local_d9 = 1;
    uVar2 = __cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_d8,in_RSI);
    LocatorInvalidException::LocatorInvalidException
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_d9 = 0;
    __cxa_throw(uVar2,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  in_RDI[4] = (int)local_68;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_68 = std::__cxx11::string::find(-0x30,(ulong)(uint)(int)*pcVar3);
  if (local_68 == -1) {
    local_101 = 1;
    uVar2 = __cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_100,in_RSI);
    LocatorInvalidException::LocatorInvalidException
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_101 = 0;
    __cxa_throw(uVar2,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  in_RDI[1] = (int)local_68;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_68 = std::__cxx11::string::find(-0x10,(ulong)(uint)(int)*pcVar3);
  if (local_68 == -1) {
    local_129 = 1;
    this_00 = (LocatorInvalidException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_128,in_RSI);
    LocatorInvalidException::LocatorInvalidException(this_00,in_stack_fffffffffffffe58);
    local_129 = 0;
    __cxa_throw(this_00,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  in_RDI[5] = (int)local_68;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_68 = std::__cxx11::string::find('\x10',(ulong)(uint)(int)*pcVar3);
  if (local_68 == -1) {
    locator_str = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string(local_150,in_RSI);
    LocatorInvalidException::LocatorInvalidException(in_stack_fffffffffffffe60,locator_str);
    __cxa_throw(locator_str,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  in_RDI[2] = (int)local_68;
  in_RDI[6] = (int)((float)*in_RDI * 10.0 - 90.0);
  in_RDI[7] = (int)((float)in_RDI[3] * 20.0 - 180.0);
  in_RDI[6] = (int)((float)in_RDI[1] + (float)in_RDI[6]);
  in_RDI[7] = (int)((float)in_RDI[7] + (float)in_RDI[4] * 2.0);
  in_RDI[6] = (int)((float)in_RDI[6] + (float)in_RDI[2] / 24.0);
  in_RDI[7] = (int)((float)in_RDI[7] + (float)in_RDI[5] / 12.0);
  in_RDI[6] = (int)((float)in_RDI[6] + 0.020833334);
  in_RDI[7] = (int)((float)in_RDI[7] + 0.041666668);
  return;
}

Assistant:

Locator::Locator(std::string loc_string)
{
  // locator must be exactly 6 characters
  if (loc_string.length() != 6)
    throw LocatorInvalidException(loc_string);
  // convert to upper case
  std::transform(loc_string.begin(), loc_string.end(), loc_string.begin(), toupper);

  // retrieve latitude and longitude indexes

  std::string::size_type sz = m_lon_array1.find(loc_string[0]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index1 = sz;
  }

  sz = m_lat_array1.find(loc_string[1]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index1 = sz;
  }

  sz = m_lon_array2.find(loc_string[2]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index2 = sz;
  }

  sz = m_lat_array2.find(loc_string[3]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index2 = sz;
  }

  sz = m_lon_array3.find(loc_string[4]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index3 = sz;
  }

  sz = m_lat_array3.find(loc_string[5]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index3 = sz;
  }

  // convert to decimal degrees for lower corner of locator square
  m_lat  = (m_lat_index1 * 10.0) - 90.0;
  m_lon  = (m_lon_index1 * 20.0) - 180.0;
  m_lat += m_lat_index2;
  m_lon += m_lon_index2 * 2.0;
  m_lat += m_lat_index3 / 24.0;
  m_lon += m_lon_index3 / 12.0;
  // adjust to center of locator square
  m_lat += 1.25 / 60.0;
  m_lon += 2.5 / 60.0;

}